

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O1

bool __thiscall
deqp::RobustBufferAccessBehavior::TexelFetchTest::verifyValidResults
          (TexelFetchTest *this,GLuint texture_id)

{
  ostringstream *poVar1;
  float fVar2;
  float fVar3;
  uchar uVar4;
  undefined1 auVar5 [8];
  GLuint i;
  int iVar6;
  GLenum GVar7;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float *pfVar8;
  bool bVar9;
  GLuint i_1;
  long lVar10;
  GLuint expected_red;
  ulong uVar11;
  uchar uVar12;
  int iVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixels_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  Texture destination_texture;
  string local_2e8;
  float local_2c0;
  float local_2bc;
  undefined1 local_2b8 [8];
  undefined8 uStack_2b0;
  Context *local_2a8;
  GLuint local_2a0;
  Context *local_298;
  GLuint local_290;
  Context *local_288;
  GLuint local_280;
  Context *local_278;
  GLuint local_270;
  Context *local_268;
  GLuint local_260;
  Context *local_258;
  Context *local_250;
  Texture local_240;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  Functions *gl;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar6);
  switch(this->m_test_case) {
  case R8:
    (*gl->bindTexture)(0xde1,texture_id);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    local_2b8 = (undefined1  [8])0x0;
    uStack_2b0 = (pointer)0x0;
    local_2a8 = (Context *)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b8,0x100);
    lVar10 = 0;
    do {
      *(uchar *)((long)local_2b8 + lVar10) = (uchar)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x100);
    (*gl->getTexImage)(0xde1,0,0x1903,0x1401,(void *)local_2b8);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar9 = true;
    uVar11 = 0;
    do {
      if (uVar11 != *(byte *)((long)local_2b8 + uVar11)) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Invalid value: ",0xf);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Expected value: ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," at offset: ",0xc);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar9 = false;
        break;
      }
      bVar14 = uVar11 != 0xff;
      uVar11 = uVar11 + 1;
    } while (bVar14);
    break;
  case RG8_SNORM:
    (*gl->bindTexture)(0xde1,texture_id);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    local_2b8 = (undefined1  [8])0x0;
    uStack_2b0 = (pointer)0x0;
    local_2a8 = (Context *)0x0;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              ((vector<signed_char,_std::allocator<signed_char>_> *)local_2b8,0x200);
    lVar10 = 0;
    do {
      *(uchar *)((long)local_2b8 + lVar10 * 2) = (uchar)lVar10;
      *(uchar *)((long)local_2b8 + lVar10 * 2 + 1) = (uchar)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x100);
    (*gl->getTexImage)(0xde1,0,0x8227,0x1400,(void *)local_2b8);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    bVar9 = true;
    uVar11 = 0;
    do {
      iVar6 = ((uint)uVar11 & 0xf) - 8;
      uVar12 = (char)(uVar11 >> 4) + 0xf8;
      iVar13 = (int)(char)*(pointer)((long)local_2b8 + uVar11 * 2);
      uVar4 = *(pointer)((long)local_2b8 + uVar11 * 2 + 1);
      if (uVar12 != uVar4 || iVar6 != iVar13) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Invalid value: ",0xf);
        std::ostream::operator<<(poVar1,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(int)(char)uVar4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Expected value: ",0x12);
        std::ostream::operator<<(poVar1,iVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::operator<<(poVar1,(int)(char)uVar12);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". At offset: ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar9 = false;
      }
      bVar14 = uVar11 != 0xff;
      uVar11 = uVar11 + 1;
    } while ((uVar12 == uVar4 && iVar6 == iVar13) && bVar14);
    break;
  case R32UI_MULTISAMPLE:
    local_2a8 = (this->super_TestCase).m_context;
    local_2b8 = (undefined1  [8])((ulong)(uint)local_2b8._4_4_ << 0x20);
    uStack_2b0 = (pointer)((ulong)uStack_2b0._4_4_ << 0x20);
    local_2a0 = 0;
    local_290 = 0;
    local_280 = 0;
    local_270 = 0;
    local_260 = 0;
    local_240.m_id = 0xffffffff;
    local_298 = local_2a8;
    local_288 = local_2a8;
    local_278 = local_2a8;
    local_268 = local_2a8;
    local_258 = local_2a8;
    local_250 = local_2a8;
    local_240.m_context = local_2a8;
    RobustBufferAccessBehavior::Texture::Generate(gl,&local_240.m_id);
    (*gl->bindTexture)(0xde1,local_240.m_id);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    (*gl->texStorage2D)(0xde1,1,0x8236,0x10,0x10);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"TexStorage2D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x361);
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,
               "#version 430 core\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout (location = 1)        writeonly uniform uimage2D   uni_destination_image;\nlayout (location = 0, r32ui) readonly  uniform uimage2DMS uni_source_image;\n\nvoid main()\n{\n    const ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n    const uint  index = gl_WorkGroupID.y * 16 + gl_WorkGroupID.x;\n\n    const uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n    const uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n    const uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n    const uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n\n    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(index + 3))))\n    {\n        imageStore(uni_destination_image, point, uvec4(1, 1, 1, 1));\n    }\n    else\n    {\n        imageStore(uni_destination_image, point, uvec4(0, 0, 0, 0));\n    }\n}\n\n"
               ,"");
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,0x1b3c1e9);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,0x1b3c1e9);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,0x1b3c1e9);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,0x1b3c1e9);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,0x1b3c1e9);
    RobustBufferAccessBehavior::Program::Init
              ((Program *)local_2b8,(string *)local_1b0,&local_2e8,&local_230,&local_1f0,&local_210,
               &local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,local_1a0[0]._M_allocated_capacity + 1);
    }
    iVar6 = (*local_250->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x1680))((ulong)local_2b8 & 0xffffffff);
    err = (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x800))();
    glu::checkError(err,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x1db);
    (*gl->bindImageTexture)(0,texture_id,0,'\0',0,35000,0x8236);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x916);
    (*gl->bindImageTexture)(1,local_240.m_id,0,'\0',0,0x88b9,0x8236);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x919);
    (*gl->uniform1i)(0,0);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x91c);
    (*gl->uniform1i)(1,1);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"Uniform1i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x91f);
    (*gl->dispatchCompute)(0x10,0x10,1);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x922);
    local_2e8._M_dataplus._M_p = (pointer)0x0;
    local_2e8._M_string_length = 0;
    local_2e8.field_2._M_allocated_capacity = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2e8,0x100);
    lVar10 = 0;
    do {
      *(int *)(local_2e8._M_dataplus._M_p + lVar10 * 4) = (int)lVar10;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x100);
    (*gl->getTexImage)(0xde1,0,0x8d94,0x1405,local_2e8._M_dataplus._M_p);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar9 = true;
    lVar10 = 0;
    do {
      if (*(int *)(local_2e8._M_dataplus._M_p + lVar10 * 4) != 1) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Invalid value: ",0xf);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Expected value: ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," at offset: ",0xc);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar9 = false;
        break;
      }
      bVar14 = lVar10 != 0xff;
      lVar10 = lVar10 + 1;
    } while (bVar14);
    if (local_2e8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_2e8._M_dataplus._M_p,
                      local_2e8.field_2._M_allocated_capacity - (long)local_2e8._M_dataplus._M_p);
    }
    RobustBufferAccessBehavior::Texture::~Texture(&local_240);
    RobustBufferAccessBehavior::Program::~Program((Program *)local_2b8);
    return bVar9;
  case RGBA32F:
    (*gl->bindTexture)(0xde1,texture_id);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    local_2b8 = (undefined1  [8])0x0;
    uStack_2b0 = (pointer)0x0;
    local_2a8 = (Context *)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_2b8,0x400);
    pfVar8 = (float *)((long)local_2b8 + 0xc);
    lVar10 = 0;
    do {
      fVar15 = (float)(int)lVar10 * 0.00390625;
      pfVar8[-3] = fVar15;
      pfVar8[-2] = fVar15;
      pfVar8[-1] = fVar15;
      *pfVar8 = fVar15;
      lVar10 = lVar10 + 1;
      pfVar8 = pfVar8 + 4;
    } while (lVar10 != 0x100);
    (*gl->getTexImage)(0xde1,0,0x1908,0x1406,(void *)local_2b8);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar9 = true;
    lVar10 = 0;
    uVar11 = 0;
    do {
      local_2c0 = (float)((uint)uVar11 & 0xf) * 0.0625;
      fVar17 = (float)((uint)(uVar11 >> 4) & 0xfffffff) * 0.0625;
      fVar16 = (float)(int)(uint)uVar11 * 0.00390625;
      local_2bc = *(float *)((long)local_2b8 + lVar10);
      fVar15 = *(float *)((long)local_2b8 + lVar10 + 4);
      fVar2 = *(float *)((long)local_2b8 + lVar10 + 8);
      fVar3 = *(float *)((long)local_2b8 + lVar10 + 0xc);
      if (((((local_2c0 != local_2bc) || (NAN(local_2c0) || NAN(local_2bc))) || (fVar17 != fVar15))
          || ((NAN(fVar17) || NAN(fVar15) || (fVar16 != fVar2)))) ||
         ((NAN(fVar16) || NAN(fVar2) || ((fVar3 != 1.0 || (NAN(fVar3))))))) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Invalid value: ",0xf);
        std::ostream::_M_insert<double>((double)local_2bc);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fVar15);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Expected value: ",0x12);
        std::ostream::_M_insert<double>((double)local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>((double)fVar16);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
        std::ostream::_M_insert<double>(1.0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,". At offset: ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar14 = true;
        bVar9 = false;
      }
      else {
        bVar14 = false;
      }
      if (bVar14) break;
      lVar10 = lVar10 + 0x10;
      bVar14 = uVar11 != 0xff;
      uVar11 = uVar11 + 1;
    } while (bVar14);
    break;
  case R32UI_MIPMAP:
    (*gl->bindTexture)(0xde1,texture_id);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    local_2b8 = (undefined1  [8])0x0;
    uStack_2b0 = (pointer)0x0;
    local_2a8 = (Context *)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b8,0x400);
    auVar5 = local_2b8;
    memset((void *)local_2b8,0,0x400);
    (*gl->getTexImage)(0xde1,1,0x8d94,0x1405,(void *)auVar5);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x2e4);
    (*gl->bindTexture)(0xde1,0);
    GVar7 = (*gl->getError)();
    glu::checkError(GVar7,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x28b);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    bVar9 = true;
    uVar11 = 0;
    do {
      if (uVar11 != (uint)*(pointer)((long)local_2b8 + uVar11 * 4)) {
        local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Invalid value: ",0xf);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,". Expected value: ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," at offset: ",0xc);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_138);
        bVar9 = false;
        break;
      }
      bVar14 = uVar11 != 0xff;
      uVar11 = uVar11 + 1;
    } while (bVar14);
    break;
  default:
    return true;
  }
  if (local_2b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2b8,(long)local_2a8 - (long)local_2b8);
  }
  return bVar9;
}

Assistant:

bool TexelFetchTest::verifyValidResults(glw::GLuint texture_id)
{
	static const GLuint height   = 16;
	static const GLuint width	= 16;
	static const GLuint n_pixels = height * width;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool result = true;

	if (R8 == m_test_case)
	{
		static const GLuint n_channels = 1;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLubyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = static_cast<GLubyte>(i);
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED, GL_UNSIGNED_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLubyte expected_red = static_cast<GLubyte>(i);
			const GLubyte drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << (GLuint)drawn_red
													<< ". Expected value: " << (GLuint)expected_red
													<< " at offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RG8_SNORM == m_test_case)
	{
		static const GLuint n_channels = 2;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLbyte> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = static_cast<GLubyte>(i);
			pixels[i * n_channels + 1] = static_cast<GLubyte>(i);
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RG, GL_BYTE, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLbyte expected_red   = static_cast<GLubyte>((i % 16) - 8);
			const GLbyte expected_green = static_cast<GLubyte>((i / 16) - 8);
			const GLbyte drawn_red		= pixels[i * n_channels + 0];
			const GLbyte drawn_green	= pixels[i * n_channels + 1];

			if ((expected_red != drawn_red) || (expected_green != drawn_green))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << (GLint)drawn_red << ", " << (GLint)drawn_green
					<< ". Expected value: " << (GLint)expected_red << ", " << (GLint)expected_green
					<< ". At offset: " << i << tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (RGBA32F == m_test_case)
	{
		static const GLuint n_channels = 4;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLfloat> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i * n_channels + 0] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 1] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 2] = (GLfloat)i / (GLfloat)n_pixels;
			pixels[i * n_channels + 3] = (GLfloat)i / (GLfloat)n_pixels;
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RGBA, GL_FLOAT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLfloat expected_red   = (GLfloat)(i % 16) / 16.0f;
			const GLfloat expected_green = (GLfloat)(i / 16) / 16.0f;
			const GLfloat expected_blue  = (GLfloat)i / 256.0f;
			const GLfloat expected_alpha = 1.0f;
			const GLfloat drawn_red		 = pixels[i * n_channels + 0];
			const GLfloat drawn_green	= pixels[i * n_channels + 1];
			const GLfloat drawn_blue	 = pixels[i * n_channels + 2];
			const GLfloat drawn_alpha	= pixels[i * n_channels + 3];

			if ((expected_red != drawn_red) || (expected_green != drawn_green) || (expected_blue != drawn_blue) ||
				(expected_alpha != drawn_alpha))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Invalid value: " << drawn_red << ", " << drawn_green << ", "
					<< drawn_blue << ", " << drawn_alpha << ". Expected value: " << expected_red << ", "
					<< expected_green << ", " << expected_blue << ", " << expected_alpha << ". At offset: " << i
					<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MIPMAP == m_test_case)
	{
		static const GLuint n_channels = 1;

		Texture::Bind(gl, texture_id, GL_TEXTURE_2D);

		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels * 4);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = 0;
		}

		Texture::GetData(gl, 1 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = i;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}
	else if (R32UI_MULTISAMPLE == m_test_case)
	{
		static const GLuint n_channels = 1;

		/* Compute shader */
		static const GLchar* cs =
			"#version 430 core\n"
			"\n"
			"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
			"\n"
			"layout (location = 1)        writeonly uniform uimage2D   uni_destination_image;\n"
			"layout (location = 0, r32ui) readonly  uniform uimage2DMS uni_source_image;\n"
			"\n"
			"void main()\n"
			"{\n"
			"    const ivec2 point = ivec2(gl_WorkGroupID.x, gl_WorkGroupID.y);\n"
			"    const uint  index = gl_WorkGroupID.y * 16 + gl_WorkGroupID.x;\n"
			"\n"
			"    const uvec4 color_0 = imageLoad(uni_source_image, point, 0);\n"
			"    const uvec4 color_1 = imageLoad(uni_source_image, point, 1);\n"
			"    const uvec4 color_2 = imageLoad(uni_source_image, point, 2);\n"
			"    const uvec4 color_3 = imageLoad(uni_source_image, point, 3);\n"
			"\n"
			"    if (any(equal(uvec4(color_0.r, color_1.r, color_2.r, color_3.r), uvec4(index + 3))))\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(1, 1, 1, 1));\n"
			"    }\n"
			"    else\n"
			"    {\n"
			"        imageStore(uni_destination_image, point, uvec4(0, 0, 0, 0));\n"
			"    }\n"
			"}\n"
			"\n";

		Program program(m_context);
		Texture destination_texture(m_context);

		Texture::Generate(gl, destination_texture.m_id);
		Texture::Bind(gl, destination_texture.m_id, GL_TEXTURE_2D);
		Texture::Storage(gl, GL_TEXTURE_2D, 1, GL_R32UI, width, height, 0 /* depth */);

		program.Init(cs, "", "", "", "", "");
		program.Use();
		gl.bindImageTexture(0 /* unit */, texture_id, 0 /* level */, GL_FALSE /* layered */, 0 /* layer */,
							GL_READ_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");
		gl.bindImageTexture(1 /* unit */, destination_texture.m_id, 0 /* level */, GL_FALSE /* layered */,
							0 /* layer */, GL_WRITE_ONLY, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindImageTexture");

		gl.uniform1i(0 /* location */, 0 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.uniform1i(1 /* location */, 1 /* image unit*/);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform1i");

		gl.dispatchCompute(16, 16, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Pixels buffer initialization */
		std::vector<GLuint> pixels;
		pixels.resize(n_pixels * n_channels);
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			pixels[i] = i;
		}

		Texture::GetData(gl, 0 /* level */, GL_TEXTURE_2D, GL_RED_INTEGER, GL_UNSIGNED_INT, &pixels[0]);

		/* Unbind */
		Texture::Bind(gl, 0, GL_TEXTURE_2D);

		/* Verify */
		for (GLuint i = 0; i < n_pixels; ++i)
		{
			const GLuint expected_red = 1;
			const GLuint drawn_red	= pixels[i];

			if (expected_red != drawn_red)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid value: " << drawn_red
													<< ". Expected value: " << expected_red << " at offset: " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}
	}

	return result;
}